

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_ref_t
flatcc_builder_create_vector
          (flatcc_builder_t *B,void *data,size_t count,size_t elem_size,uint16_t align,
          size_t max_count)

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  flatcc_builder_ref_t fVar4;
  uint uVar5;
  flatbuffers_uoffset_t length_prefix;
  flatcc_iov_state_t local_90;
  
  if (count <= max_count) {
    uVar2 = 4;
    if (4 < align) {
      uVar2 = align;
    }
    if (B->min_align < uVar2) {
      B->min_align = uVar2;
    }
    length_prefix = (flatbuffers_uoffset_t)count;
    uVar5 = (int)elem_size * length_prefix;
    local_90.iov[0].iov_base = &length_prefix;
    uVar3 = uVar2 - 1 & B->emit_start - uVar5;
    local_90.len = 4;
    local_90.iov[0].iov_len = 4;
    local_90.count = 1;
    if (uVar5 == 0) {
      iVar1 = 1;
    }
    else {
      local_90.iov[1].iov_len = (size_t)uVar5;
      local_90.len = local_90.iov[1].iov_len + 4;
      local_90.count = 2;
      iVar1 = 2;
      local_90.iov[1].iov_base = data;
    }
    if (uVar3 != 0) {
      local_90.len = local_90.len + uVar3;
      *(uint8_t **)((long)&local_90.iov[0].iov_base + (ulong)(uint)(iVar1 << 4)) = "";
      *(ulong *)((long)&local_90.iov[0].iov_len + (ulong)(uint)(iVar1 << 4)) = (ulong)uVar3;
      local_90.count = iVar1 + 1;
    }
    fVar4 = emit_front(B,&local_90);
    return fVar4;
  }
  __assert_fail("count <= max_count",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x572,
                "flatcc_builder_ref_t flatcc_builder_create_vector(flatcc_builder_t *, const void *, size_t, size_t, uint16_t, size_t)"
               );
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_vector(flatcc_builder_t *B,
        const void *data, size_t count, size_t elem_size, uint16_t align, size_t max_count)
{
    /*
     * Note: it is important that vec_size is uoffset not size_t
     * in case sizeof(uoffset_t) > sizeof(size_t) because max_count is
     * defined in terms of uoffset_t representation size, and also
     * because we risk accepting too large a vector even if max_count is
     * not violated.
     */
    uoffset_t vec_size, vec_pad, length_prefix;
    iov_state_t iov;

    check_error(count <= max_count, 0, "vector max_count violated");
    get_min_align(&align, field_size);
    set_min_align(B, align);
    vec_size = (uoffset_t)count * (uoffset_t)elem_size;
    /*
     * That can happen on 32 bit systems when uoffset_t is defined as 64-bit.
     * `emit_front/back` captures overflow, but not if our size type wraps first.
     */
#if FLATBUFFERS_UOFFSET_MAX > SIZE_MAX
    check_error(vec_size < SIZE_MAX, 0, "vector larger than address space");
#endif
    write_uoffset(&length_prefix, (uoffset_t)count);
    /* Alignment is calculated for the first element, not the header. */
    vec_pad = front_pad(B, vec_size, align);
    init_iov();
    push_iov(&length_prefix, field_size);
    push_iov(data, vec_size);
    push_iov(_pad, vec_pad);
    return emit_front(B, &iov);
}